

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall
Lowerer::GenerateRecyclerOrMarkTempAlloc
          (Lowerer *this,Instr *instr,RegOpnd *dstOpnd,JnHelperMethod allocHelper,size_t allocSize,
          SymOpnd **tempObjectSymOpnd)

{
  SymOpnd *pSVar1;
  bool bVar2;
  SymOpnd **tempObjectSymOpnd_local;
  size_t allocSize_local;
  JnHelperMethod allocHelper_local;
  RegOpnd *dstOpnd_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  bVar2 = (*(ushort *)&instr->field_0x36 >> 3 & 1) == 0;
  if (bVar2) {
    GenerateRecyclerAlloc(this,allocHelper,allocSize,dstOpnd,instr,false);
    *tempObjectSymOpnd = (SymOpnd *)0x0;
  }
  else {
    pSVar1 = GenerateMarkTempAlloc(this,dstOpnd,allocSize,instr);
    *tempObjectSymOpnd = pSVar1;
  }
  return bVar2;
}

Assistant:

bool
Lowerer::GenerateRecyclerOrMarkTempAlloc(IR::Instr * instr, IR::RegOpnd * dstOpnd, IR::JnHelperMethod allocHelper, size_t allocSize, IR::SymOpnd ** tempObjectSymOpnd)
{
    if (instr->dstIsTempObject)
    {
        *tempObjectSymOpnd = GenerateMarkTempAlloc(dstOpnd, allocSize, instr);
        return false;
    }

    this->GenerateRecyclerAlloc(allocHelper, allocSize, dstOpnd, instr);
    *tempObjectSymOpnd = nullptr;
    return true;
}